

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O0

TestCaseGroup * vkt::compute::createIndirectComputeDispatchTests(TestContext *testCtx)

{
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  IndirectDispatchCaseBufferUpload *this;
  uint local_47c;
  deUint32 ndx_1;
  TestCaseGroup *groupBufferGenerate;
  deUint32 ndx;
  TestCaseGroup *groupBufferUpload;
  undefined1 local_458 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> indirectComputeDispatchTests;
  DispatchCommand local_438;
  Vector<unsigned_int,_3> local_41c;
  DispatchCommand local_410;
  Vector<unsigned_int,_3> local_3f4;
  DispatchCommand local_3e8;
  Vector<unsigned_int,_3> local_3cc;
  DispatchCommand local_3c0;
  Vector<unsigned_int,_3> local_3a4;
  DispatchCommand local_398;
  Vector<unsigned_int,_3> local_37c;
  DispatchCommand local_370;
  Vector<unsigned_int,_3> local_354;
  DispatchCommand local_348;
  DispatchCommandsVec local_330;
  Vector<unsigned_int,_3> local_318;
  Vector<unsigned_int,_3> local_30c;
  DispatchCommand local_300;
  Vector<unsigned_int,_3> local_2e4;
  DispatchCommand local_2d8;
  Vector<unsigned_int,_3> local_2bc;
  DispatchCommand local_2b0;
  Vector<unsigned_int,_3> local_294;
  DispatchCommand local_288;
  Vector<unsigned_int,_3> local_26c;
  DispatchCommand local_260;
  DispatchCommandsVec local_248;
  Vector<unsigned_int,_3> local_230;
  Vector<unsigned_int,_3> local_224;
  DispatchCommand local_218;
  DispatchCommandsVec local_200;
  Vector<unsigned_int,_3> local_1e8;
  Vector<unsigned_int,_3> local_1dc;
  DispatchCommand local_1d0;
  DispatchCommandsVec local_1b8;
  Vector<unsigned_int,_3> local_1a0;
  Vector<unsigned_int,_3> local_194;
  DispatchCommand local_188;
  DispatchCommandsVec local_170;
  Vector<unsigned_int,_3> local_158;
  Vector<unsigned_int,_3> local_14c;
  DispatchCommand local_140;
  DispatchCommandsVec local_128;
  Vector<unsigned_int,_3> local_110;
  Vector<unsigned_int,_3> local_104;
  DispatchCommand local_f8;
  DispatchCommandsVec local_e0;
  Vector<unsigned_int,_3> local_c8;
  Vector<unsigned_int,_3> local_bc;
  DispatchCommand local_b0;
  DispatchCommandsVec local_98;
  Vector<unsigned_int,_3> local_80;
  Vector<unsigned_int,_3> local_74;
  DispatchCommand local_68;
  DispatchCommandsVec local_50;
  Vector<unsigned_int,_3> local_24;
  DispatchCaseDesc *local_18;
  TestContext *local_10;
  TestContext *testCtx_local;
  
  local_10 = testCtx;
  if (createIndirectComputeDispatchTests(tcu::TestContext&)::s_dispatchCases == '\0') {
    iVar1 = __cxa_guard_acquire(&createIndirectComputeDispatchTests(tcu::TestContext&)::
                                 s_dispatchCases);
    if (iVar1 != 0) {
      indirectComputeDispatchTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._11_1_ =
           1;
      local_18 = createIndirectComputeDispatchTests::s_dispatchCases;
      tcu::Vector<unsigned_int,_3>::Vector(&local_24,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_74,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_68,0,&local_74);
      anon_unknown_1::commandsVec(&local_50,&local_68);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases,"single_invocation",
                 "Single invocation only from offset 0",0xc,&local_24,&local_50);
      local_18 = (DispatchCaseDesc *)0x16b12d0;
      tcu::Vector<unsigned_int,_3>::Vector(&local_80,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_bc,2,3,5);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_b0,0,&local_bc);
      anon_unknown_1::commandsVec(&local_98,&local_b0);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 1,"multiple_groups",
                 "Multiple groups dispatched from offset 0",0xc,&local_80,&local_98);
      local_18 = (DispatchCaseDesc *)0x16b1310;
      tcu::Vector<unsigned_int,_3>::Vector(&local_c8,2,3,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_104,1,2,3);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_f8,0,&local_104);
      anon_unknown_1::commandsVec(&local_e0,&local_f8);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 2,
                 "multiple_groups_multiple_invocations",
                 "Multiple groups of size 2x3x1 from offset 0",0xc,&local_c8,&local_e0);
      local_18 = (DispatchCaseDesc *)0x16b1350;
      tcu::Vector<unsigned_int,_3>::Vector(&local_110,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_14c,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_140,0x10,&local_14c);
      anon_unknown_1::commandsVec(&local_128,&local_140);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 3,"small_offset",
                 "Small offset",0x1c,&local_110,&local_128);
      local_18 = (DispatchCaseDesc *)0x16b1390;
      tcu::Vector<unsigned_int,_3>::Vector(&local_158,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_194,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_188,0x10000c,&local_194);
      anon_unknown_1::commandsVec(&local_170,&local_188);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 4,"large_offset",
                 "Large offset",0x200000,&local_158,&local_170);
      local_18 = (DispatchCaseDesc *)0x16b13d0;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1a0,2,3,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_1dc,1,2,3);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_1d0,0x10000c,&local_1dc);
      anon_unknown_1::commandsVec(&local_1b8,&local_1d0);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 5,
                 "large_offset_multiple_invocations","Large offset, multiple invocations",0x200000,
                 &local_1a0,&local_1b8);
      local_18 = (DispatchCaseDesc *)0x16b1410;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1e8,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_224,0,0,0);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_218,0,&local_224);
      anon_unknown_1::commandsVec(&local_200,&local_218);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 6,"empty_command",
                 "Empty command",0xc,&local_1e8,&local_200);
      local_18 = (DispatchCaseDesc *)0x16b1450;
      tcu::Vector<unsigned_int,_3>::Vector(&local_230,3,1,2);
      tcu::Vector<unsigned_int,_3>::Vector(&local_26c,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_260,0,&local_26c);
      tcu::Vector<unsigned_int,_3>::Vector(&local_294,2,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_288,0xc,&local_294);
      tcu::Vector<unsigned_int,_3>::Vector(&local_2bc,1,3,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_2b0,0x68,&local_2bc);
      tcu::Vector<unsigned_int,_3>::Vector(&local_2e4,1,1,7);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_2d8,0x28,&local_2e4);
      tcu::Vector<unsigned_int,_3>::Vector(&local_30c,1,1,4);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_300,0x34,&local_30c);
      anon_unknown_1::commandsVec(&local_248,&local_260,&local_288,&local_2b0,&local_2d8,&local_300)
      ;
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 7,"multi_dispatch",
                 "Dispatch multiple compute commands from single buffer",0x400,&local_230,&local_248
                );
      local_18 = (DispatchCaseDesc *)0x16b1490;
      tcu::Vector<unsigned_int,_3>::Vector(&local_318,3,1,2);
      tcu::Vector<unsigned_int,_3>::Vector(&local_354,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_348,0,&local_354);
      tcu::Vector<unsigned_int,_3>::Vector(&local_37c,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_370,0,&local_37c);
      tcu::Vector<unsigned_int,_3>::Vector(&local_3a4,1,1,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_398,0,&local_3a4);
      tcu::Vector<unsigned_int,_3>::Vector(&local_3cc,1,3,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_3c0,0x68,&local_3cc);
      tcu::Vector<unsigned_int,_3>::Vector(&local_3f4,1,3,1);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_3e8,0x68,&local_3f4);
      tcu::Vector<unsigned_int,_3>::Vector(&local_41c,1,1,4);
      anon_unknown_1::DispatchCommand::DispatchCommand(&local_410,0x34,&local_41c);
      tcu::Vector<unsigned_int,_3>::Vector
                ((Vector<unsigned_int,_3> *)
                 &indirectComputeDispatchTests.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0xc,1,1,4);
      anon_unknown_1::DispatchCommand::DispatchCommand
                (&local_438,0x34,
                 (UVec3 *)&indirectComputeDispatchTests.
                           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                           .m_data.field_0xc);
      anon_unknown_1::commandsVec
                (&local_330,&local_348,&local_370,&local_398,&local_3c0,&local_3e8,&local_410,
                 &local_438);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 8,
                 "multi_dispatch_reuse_command",
                 "Dispatch multiple compute commands from single buffer",0x400,&local_318,&local_330
                );
      indirectComputeDispatchTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._11_1_ =
           0;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_330);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_248);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_200);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_1b8);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_170);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_128);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_e0);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_98);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~vector(&local_50);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createIndirectComputeDispatchTests(tcu::TestContext&)::s_dispatchCases);
    }
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,local_10,"indirect_dispatch","Indirect dispatch tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&groupBufferUpload + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_458,
             pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_10,"upload_buffer","");
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_458)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (groupBufferGenerate._4_4_ = 0; groupBufferGenerate._4_4_ < 9;
      groupBufferGenerate._4_4_ = groupBufferGenerate._4_4_ + 1) {
    this = (IndirectDispatchCaseBufferUpload *)operator_new(0xa8);
    anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
              (this,local_10,
               createIndirectComputeDispatchTests::s_dispatchCases + groupBufferGenerate._4_4_,
               GLSL_VERSION_310_ES);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_10,"gen_in_compute","");
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_458)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (local_47c = 0; local_47c < 9; local_47c = local_47c + 1) {
    pTVar4 = (TestNode *)operator_new(0xa8);
    anon_unknown_1::IndirectDispatchCaseBufferGenerate::IndirectDispatchCaseBufferGenerate
              ((IndirectDispatchCaseBufferGenerate *)pTVar4,local_10,
               createIndirectComputeDispatchTests::s_dispatchCases + local_47c,GLSL_VERSION_310_ES);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_458
                  );
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_458);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createIndirectComputeDispatchTests (tcu::TestContext& testCtx)
{
	static const DispatchCaseDesc s_dispatchCases[] =
	{
		DispatchCaseDesc("single_invocation", "Single invocation only from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)))
        ),
		DispatchCaseDesc("multiple_groups", "Multiple groups dispatched from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(2, 3, 5)))
		),
		DispatchCaseDesc("multiple_groups_multiple_invocations", "Multiple groups of size 2x3x1 from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(2, 3, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 2, 3)))
		),
		DispatchCaseDesc("small_offset", "Small offset", 16 + INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(16, tcu::UVec3(1, 1, 1)))
		),
		DispatchCaseDesc("large_offset", "Large offset", (2 << 20), tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand((1 << 20) + 12, tcu::UVec3(1, 1, 1)))
		),
		DispatchCaseDesc("large_offset_multiple_invocations", "Large offset, multiple invocations", (2 << 20), tcu::UVec3(2, 3, 1),
			commandsVec(DispatchCommand((1 << 20) + 12, tcu::UVec3(1, 2, 3)))
		),
		DispatchCaseDesc("empty_command", "Empty command", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(0, 0, 0)))
		),
		DispatchCaseDesc("multi_dispatch", "Dispatch multiple compute commands from single buffer", 1 << 10, tcu::UVec3(3, 1, 2),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(INDIRECT_COMMAND_OFFSET, tcu::UVec3(2, 1, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(40, tcu::UVec3(1, 1, 7)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)))
		),
		DispatchCaseDesc("multi_dispatch_reuse_command", "Dispatch multiple compute commands from single buffer", 1 << 10, tcu::UVec3(3, 1, 2),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)))
		),
	};

	de::MovePtr<tcu::TestCaseGroup> indirectComputeDispatchTests(new tcu::TestCaseGroup(testCtx, "indirect_dispatch", "Indirect dispatch tests"));

	tcu::TestCaseGroup* const	groupBufferUpload = new tcu::TestCaseGroup(testCtx, "upload_buffer", "");
	indirectComputeDispatchTests->addChild(groupBufferUpload);

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_dispatchCases); ndx++)
	{
		groupBufferUpload->addChild(new IndirectDispatchCaseBufferUpload(testCtx, s_dispatchCases[ndx], glu::GLSL_VERSION_310_ES));
	}

	tcu::TestCaseGroup* const	groupBufferGenerate = new tcu::TestCaseGroup(testCtx, "gen_in_compute", "");
	indirectComputeDispatchTests->addChild(groupBufferGenerate);

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_dispatchCases); ndx++)
	{
		groupBufferGenerate->addChild(new IndirectDispatchCaseBufferGenerate(testCtx, s_dispatchCases[ndx], glu::GLSL_VERSION_310_ES));
	}

	return indirectComputeDispatchTests.release();
}